

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_dynhds_add_custom(Curl_easy *data,_Bool is_connect,dynhds *hds)

{
  connectdata *pcVar1;
  bool bVar2;
  _Bool _Var3;
  CURLcode CVar4;
  char cVar5;
  size_t sStack_80;
  CURLcode result;
  size_t valuelen;
  size_t namelen;
  char *value;
  char *name;
  int local_58;
  proxy_use proxy;
  int i;
  int numlists;
  curl_slist *headers;
  curl_slist *h [2];
  char *ptr;
  connectdata *conn;
  dynhds *hds_local;
  _Bool is_connect_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  proxy = HEADER_PROXY;
  if (is_connect) {
    cVar5 = '\x02';
  }
  else {
    cVar5 = '\0';
    if (((ulong)pcVar1->bits & 1) != 0) {
      cVar5 = ((ulong)pcVar1->bits >> 3 & 1) == 0;
    }
  }
  if (((cVar5 != '\0') && (cVar5 == '\x01')) && ((*(ulong *)&(data->set).field_0x8ca >> 3 & 1) != 0)
     ) {
    h[0] = (data->set).proxyheaders;
    proxy = HEADER_CONNECT;
  }
  local_58 = 0;
  do {
    if ((int)proxy <= local_58) {
      return CURLE_OK;
    }
    for (_i = h[(long)local_58 + -1]; _i != (curl_slist *)0x0; _i = _i->next) {
      h[1] = (curl_slist *)strchr(_i->data,0x3a);
      if (h[1] == (curl_slist *)0x0) {
        h[1] = (curl_slist *)strchr(_i->data,0x3b);
        if (h[1] != (curl_slist *)0x0) {
          value = _i->data;
          valuelen = (long)h[1] - (long)_i->data;
          h[1] = (curl_slist *)((long)&h[1]->data + 1);
          while( true ) {
            bVar2 = false;
            if (((*(char *)&h[1]->data != '\0') && (bVar2 = true, *(char *)&h[1]->data != ' ')) &&
               ((bVar2 = true, *(char *)&h[1]->data != '\t' &&
                (bVar2 = false, '\t' < *(char *)&h[1]->data)))) {
              bVar2 = *(char *)&h[1]->data < '\x0e';
            }
            if (!bVar2) break;
            h[1] = (curl_slist *)((long)&h[1]->data + 1);
          }
          if (*(char *)&h[1]->data == '\0') {
            namelen = (long)"n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29;
            sStack_80 = 0;
            goto LAB_0014cebe;
          }
        }
      }
      else {
        value = _i->data;
        valuelen = (long)h[1] - (long)_i->data;
        h[1] = (curl_slist *)((long)&h[1]->data + 1);
        while( true ) {
          bVar2 = false;
          if (((*(char *)&h[1]->data != '\0') && (bVar2 = true, *(char *)&h[1]->data != ' ')) &&
             ((bVar2 = true, *(char *)&h[1]->data != '\t' &&
              (bVar2 = false, '\t' < *(char *)&h[1]->data)))) {
            bVar2 = *(char *)&h[1]->data < '\x0e';
          }
          if (!bVar2) break;
          h[1] = (curl_slist *)((long)&h[1]->data + 1);
        }
        if (*(char *)&h[1]->data != '\0') {
          namelen = (size_t)h[1];
          sStack_80 = strlen((char *)h[1]);
LAB_0014cebe:
          if ((((((data->state).aptr.host == (char *)0x0) ||
                (_Var3 = hd_name_eq(value,valuelen,"Host:",5), !_Var3)) &&
               (((data->state).httpreq != '\x02' ||
                (_Var3 = hd_name_eq(value,valuelen,"Content-Type:",0xd), !_Var3)))) &&
              (((data->state).httpreq != '\x03' ||
               (_Var3 = hd_name_eq(value,valuelen,"Content-Type:",0xd), !_Var3)))) &&
             ((((*(uint *)&(data->req).field_0xd9 >> 0x12 & 1) == 0 ||
               (_Var3 = hd_name_eq(value,valuelen,"Content-Length:",0xf), !_Var3)) &&
              (((((data->state).aptr.te == (char *)0x0 ||
                 (_Var3 = hd_name_eq(value,valuelen,"Connection:",0xb), !_Var3)) &&
                ((pcVar1->httpversion < 0x14 ||
                 (_Var3 = hd_name_eq(value,valuelen,"Transfer-Encoding:",0x12), !_Var3)))) &&
               ((((_Var3 = hd_name_eq(value,valuelen,"Authorization:",0xe), !_Var3 &&
                  (_Var3 = hd_name_eq(value,valuelen,"Cookie:",7), !_Var3)) ||
                 (_Var3 = Curl_auth_allowed_to_host(data), _Var3)) &&
                (CVar4 = Curl_dynhds_add(hds,value,valuelen,(char *)namelen,sStack_80),
                CVar4 != CURLE_OK)))))))) {
            return CVar4;
          }
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_dynhds_add_custom(struct Curl_easy *data,
                                bool is_connect,
                                struct dynhds *hds)
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    for(headers = h[i]; headers; headers = headers->next) {
      const char *name, *value;
      size_t namelen, valuelen;

      /* There are 2 quirks in place for custom headers:
       * 1. setting only 'name:' to suppress a header from being sent
       * 2. setting only 'name;' to send an empty (illegal) header
       */
      ptr = strchr(headers->data, ':');
      if(ptr) {
        name = headers->data;
        namelen = ptr - headers->data;
        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;
        if(*ptr) {
          value = ptr;
          valuelen = strlen(value);
        }
        else {
          /* quirk #1, suppress this header */
          continue;
        }
      }
      else {
        ptr = strchr(headers->data, ';');

        if(!ptr) {
          /* neither : nor ; in provided header value. We seem
           * to ignore this silently */
          continue;
        }

        name = headers->data;
        namelen = ptr - headers->data;
        ptr++; /* pass the semicolon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;
        if(!*ptr) {
          /* quirk #2, send an empty header */
          value = "";
          valuelen = 0;
        }
        else {
          /* this may be used for something else in the future,
           * ignore this for now */
          continue;
        }
      }

      DEBUGASSERT(name && value);
      if(data->state.aptr.host &&
         /* a Host: header was sent already, do not pass on any custom Host:
            header as that will produce *two* in the same request! */
         hd_name_eq(name, namelen, STRCONST("Host:")))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_FORM &&
              /* this header (extended by formdata.c) is sent later */
              hd_name_eq(name, namelen, STRCONST("Content-Type:")))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_MIME &&
              /* this header is sent later */
              hd_name_eq(name, namelen, STRCONST("Content-Type:")))
        ;
      else if(data->req.authneg &&
              /* while doing auth neg, do not allow the custom length since
                 we will force length zero then */
              hd_name_eq(name, namelen, STRCONST("Content-Length:")))
        ;
      else if(data->state.aptr.te &&
              /* when asking for Transfer-Encoding, do not pass on a custom
                 Connection: */
              hd_name_eq(name, namelen, STRCONST("Connection:")))
        ;
      else if((conn->httpversion >= 20) &&
              hd_name_eq(name, namelen, STRCONST("Transfer-Encoding:")))
        /* HTTP/2 does not support chunked requests */
        ;
      else if((hd_name_eq(name, namelen, STRCONST("Authorization:")) ||
               hd_name_eq(name, namelen, STRCONST("Cookie:"))) &&
              /* be careful of sending this potentially sensitive header to
                 other hosts */
              !Curl_auth_allowed_to_host(data))
        ;
      else {
        CURLcode result;

        result = Curl_dynhds_add(hds, name, namelen, value, valuelen);
        if(result)
          return result;
      }
    }
  }

  return CURLE_OK;
}